

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_param_tests.hpp
# Opt level: O2

void __thiscall
iutest_typed_test_suite_p_name_TypeParamTest_::StaticMul2<int>::Body(StaticMul2<int> *this)

{
  int *in_R9;
  undefined1 local_1e8 [48];
  AssertionResult iutest_ar;
  Fixed local_190;
  
  TypeParamTest<int>::value = 1;
  local_1e8._0_4_ = 2;
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = local_1e8._0_4_;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"TestFixture::value+TestFixture::value","2*TestFixture::value",
             (char *)&local_190,(int *)local_1e8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/type_param_tests.hpp"
               ,0x2f,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_1e8,&local_190);
    std::__cxx11::string::~string((string *)local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST_P(TypeParamTest, StaticMul2)
{
    TestFixture::value = 1;
    IUTEST_ASSERT_EQ(TestFixture::value+TestFixture::value, 2*TestFixture::value);
}